

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNlaProductForm.cpp
# Opt level: O2

HighsInt __thiscall
ProductFormUpdate::update(ProductFormUpdate *this,HVector *aq,HighsInt *pivot_row)

{
  HighsInt HVar1;
  HighsInt iX;
  long lVar2;
  HighsInt iRow;
  double pivot;
  
  if (0x31 < this->update_count_) {
    return 1;
  }
  pivot = (aq->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[*pivot_row];
  if (1e-08 <= ABS(pivot)) {
    std::vector<int,_std::allocator<int>_>::push_back(&this->pivot_index_,pivot_row);
    std::vector<double,_std::allocator<double>_>::push_back(&this->pivot_value_,&pivot);
    for (lVar2 = 0; lVar2 < aq->count; lVar2 = lVar2 + 1) {
      iRow = (aq->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[lVar2];
      if (iRow != *pivot_row) {
        std::vector<int,_std::allocator<int>_>::push_back(&this->index_,&iRow);
        std::vector<double,_std::allocator<double>_>::push_back
                  (&this->value_,
                   (aq->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + iRow);
      }
    }
    iRow = (HighsInt)
           ((ulong)((long)(this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 2);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->start_,&iRow);
    this->update_count_ = this->update_count_ + 1;
    HVar1 = 0;
  }
  else {
    HVar1 = 7;
  }
  return HVar1;
}

Assistant:

HighsInt ProductFormUpdate::update(HVector* aq, HighsInt* pivot_row) {
  assert(0 <= *pivot_row && *pivot_row < num_row_);
  if (update_count_ >= kProductFormMaxUpdates)
    return kRebuildReasonUpdateLimitReached;
  double pivot = aq->array[*pivot_row];
  if (fabs(pivot) < kProductFormPivotTolerance)
    return kRebuildReasonPossiblySingularBasis;
  pivot_index_.push_back(*pivot_row);
  pivot_value_.push_back(pivot);
  for (HighsInt iX = 0; iX < aq->count; iX++) {
    HighsInt iRow = aq->index[iX];
    if (iRow == *pivot_row) continue;
    index_.push_back(iRow);
    value_.push_back(aq->array[iRow]);
  }
  start_.push_back(index_.size());
  update_count_++;
  return kRebuildReasonNo;
}